

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CRange::process(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *__return_storage_ptr__,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *commands,short sswitch,
                 vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *targets)

{
  bool bVar1;
  pointer pbVar2;
  istream *piVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pbVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long local_458;
  istringstream c;
  byte abStack_438 [352];
  undefined1 local_2d8 [8];
  Tdata target;
  ostringstream r;
  uint auStack_238 [88];
  undefined1 auStack_d8 [8];
  vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> rt;
  undefined1 local_b8 [8];
  string task;
  string targname;
  double local_68;
  double red2;
  double a1;
  double local_50;
  double red1;
  double z1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar6 = (commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar6) {
    auStack_d8 = (undefined1  [8])0x0;
    rt.super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rt.super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    targname.field_2._8_8_ = commands;
    for (; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
      std::__cxx11::istringstream::istringstream((istringstream *)&local_458,(string *)pbVar6,_S_in)
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&target._hash);
      local_b8 = (undefined1  [8])&task._M_string_length;
      task._M_dataplus._M_p = (pointer)0x0;
      task._M_string_length._0_1_ = 0;
      task.field_2._8_8_ = &targname._M_string_length;
      targname._M_dataplus._M_p = (pointer)0x0;
      targname._M_string_length._0_1_ = 0;
      piVar3 = std::operator>>((istream *)&local_458,(string *)local_b8);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      std::operator>>(piVar3,(string *)(task.field_2._M_local_buf + 8));
      if ((abStack_438[*(long *)(local_458 + -0x18)] & 2) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid command detected: ");
        poVar4 = std::operator<<(poVar4,(string *)pbVar6);
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar7 = 0;
        uVar8 = 0xc0c38780;
      }
      else {
        find_target((Tdata *)local_2d8,(string *)((long)&task.field_2 + 8),targets);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2d8,"Unknown");
        pcVar5 = "Invalid target detected in command: ";
        if (bVar1) {
LAB_0010a866:
          poVar4 = std::operator<<((ostream *)&std::cerr,pcVar5);
          poVar4 = std::operator<<(poVar4,(string *)pbVar6);
          std::endl<char,std::char_traits<char>>(poVar4);
          z1 = -9999.0;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"r");
          if (bVar1) {
            z1 = range(local_50,red1,red2,sswitch,(Tdata *)local_2d8,
                       (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)auStack_d8
                      );
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"e");
            if (bVar1) {
              z1 = renergy(local_50,local_68,red1,red2,sswitch,(Tdata *)local_2d8,
                           (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)
                           auStack_d8);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"d");
              if (bVar1) {
                z1 = dedx(local_50,local_68,red1,red2,sswitch,(Tdata *)local_2d8);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8,"j");
                pcVar5 = "Invalid task detected in command: ";
                if (!bVar1) goto LAB_0010a866;
                z1 = djdx(local_50,red1,2.0,0.05,3.04,sswitch,(Tdata *)local_2d8);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)local_2d8);
        uVar7 = SUB84(z1,0);
        uVar8 = (undefined4)((ulong)z1 >> 0x20);
      }
      *(undefined8 *)(&r + *(long *)((long)target._hash + -0x18)) = 6;
      *(uint *)((long)auStack_238 + *(long *)((long)target._hash + -0x18)) =
           *(uint *)((long)auStack_238 + *(long *)((long)target._hash + -0x18)) & 0xfffffefb | 4;
      std::ostream::_M_insert<double>((double)CONCAT44(uVar8,uVar7));
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)(task.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&target._hash);
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_458);
      pbVar2 = *(pointer *)(targname.field_2._8_8_ + 8);
    }
    std::vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>::~vector
              ((vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)auStack_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CRange::process( std::vector<std::string> &commands, short sswitch, std::vector<CRange::Tdata> &targets )
{
    std::vector<std::string> results;
    if (commands.size() == 0) return results;
    std::vector<CRange::RangeTable> rt;
    for (std::vector<std::string>::iterator it=commands.begin(); it != commands.end(); ++it) {
        std::istringstream c(*it);
        std::ostringstream r;
        std::string task, targname;
        double red1, red2, z1, a1;
        double out = -9999.0;
        c >> task >> red1 >> red2 >> z1 >> a1 >> targname;
        //
        // c.good() will be false, even on a good read, because a good read
        // will also reach the end of input, so we test eof instead.
        //
        if (c.eof()) {
            CRange::Tdata target = CRange::find_target(targname, targets);
            if (target.name() == "Unknown") {
                std::cerr << "Invalid target detected in command: " << *it << std::endl;
            } else {
                if (task == "r") {
                    out = CRange::range(red1,z1,a1,sswitch,target,rt);
                } else if (task == "e") {
                    out = CRange::renergy(red1,red2,z1,a1,sswitch,target,rt);
                } else if (task == "d") {
                    out = CRange::dedx(red1,red2,z1,a1,sswitch,target);
                } else if (task == "j") {
                    out = CRange::djdx(red1, z1, 2.0, 0.05, 3.04, sswitch, target);
                } else {
                    std::cerr << "Invalid task detected in command: " << *it << std::endl;
                }
            }
        } else {
            std::cerr << "Invalid command detected: " << *it << std::endl;
        }
        r << std::setprecision(6) << std::fixed << out;
        // r << std::setprecision(5) << std::scientific << out;
        results.push_back(r.str());
    }
    return results;
}